

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

char * glslang::TIntermediate::getResourceName(TResourceType res)

{
  char *pcStack_10;
  TResourceType res_local;
  
  switch(res) {
  case EResSampler:
    pcStack_10 = "shift-sampler-binding";
    break;
  case EResTexture:
    pcStack_10 = "shift-texture-binding";
    break;
  case EResImage:
    pcStack_10 = "shift-image-binding";
    break;
  case EResUbo:
    pcStack_10 = "shift-UBO-binding";
    break;
  case EResSsbo:
    pcStack_10 = "shift-ssbo-binding";
    break;
  case EResUav:
    pcStack_10 = "shift-uav-binding";
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                  ,0xed9,"static const char *glslang::TIntermediate::getResourceName(TResourceType)"
                 );
  }
  return pcStack_10;
}

Assistant:

const char* TIntermediate::getResourceName(TResourceType res)
{
    switch (res) {
    case EResSampler: return "shift-sampler-binding";
    case EResTexture: return "shift-texture-binding";
    case EResImage:   return "shift-image-binding";
    case EResUbo:     return "shift-UBO-binding";
    case EResSsbo:    return "shift-ssbo-binding";
    case EResUav:     return "shift-uav-binding";
    default:
        assert(0); // internal error: should only be called with valid resource types.
        return nullptr;
    }
}